

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

int Cof_ManTfiSize_rec(Cof_Man_t *p,Cof_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 0;
  if (pObj->Value != p->nTravIds) {
    pObj->Value = p->nTravIds;
    uVar1 = *(uint *)pObj;
    iVar3 = 0;
    if ((uVar1 & 0xf1) != 1) {
      if (((uVar1 & 1) != 0) || ((uVar1 & 0xf0) == 0)) {
        __assert_fail("Cof_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                      ,0x117,"int Cof_ManTfiSize_rec(Cof_Man_t *, Cof_Obj_t *)");
      }
      iVar3 = 0;
      for (uVar4 = 0; uVar4 < (uVar1 >> 4 & 0xf); uVar4 = uVar4 + 1) {
        iVar2 = Cof_ManTfiSize_rec(p,(Cof_Obj_t *)
                                     ((long)pObj +
                                     (ulong)(*(uint *)(&pObj[1].field_0x0 + uVar4 * 4) & 0x7fffffff)
                                     * -4));
        iVar3 = iVar3 + iVar2;
        uVar1 = *(uint *)pObj;
      }
      iVar3 = iVar3 + 1;
    }
  }
  return iVar3;
}

Assistant:

int Cof_ManTfiSize_rec( Cof_Man_t * p, Cof_Obj_t * pObj )
{
    Cof_Obj_t * pNext;
    unsigned i, Counter = 0;
    if ( Cof_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Cof_ObjSetTravIdCurrent(p, pObj);
    if ( Cof_ObjIsCi(pObj) )
        return 0;
    assert( Cof_ObjIsNode(pObj) );
    Cof_ObjForEachFanin( pObj, pNext, i )
        Counter += Cof_ManTfiSize_rec( p, pNext );
    return 1 + Counter;
}